

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

LispPTR findptrsbuffer(LispPTR ptr)

{
  LispPTR LVar1;
  LispPTR *NAddr;
  
  LVar1 = *System_Buffer_List_word;
  while( true ) {
    NAddr = NativeAligned4FromLAddr(LVar1);
    LVar1 = LAddrFromNative(NAddr);
    if (LVar1 == 0) {
      return 0;
    }
    if (NAddr[1] == ptr) break;
    LVar1 = NAddr[3] & 0xfffffff;
  }
  LVar1 = LAddrFromNative(NAddr);
  return LVar1;
}

Assistant:

LispPTR findptrsbuffer(LispPTR ptr) {
  struct buf *bptr;
  bptr = (struct buf *)NativeAligned4FromLAddr(*System_Buffer_List_word);
  while (LAddrFromNative(bptr) != NIL) {
    if (ptr == bptr->vmempage)
      return (LAddrFromNative(bptr));
    else
      bptr = (struct buf *)NativeAligned4FromLAddr(bptr->sysnext);
  }
  return (NIL);
}